

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O3

void __thiscall
QtMWidgets::MessageBox::MessageBox(MessageBox *this,QString *title,QString *text,QWidget *parent)

{
  MsgBoxButton *pMVar1;
  MessageBoxPrivate *this_00;
  undefined4 *puVar2;
  QObject local_50 [8];
  code *local_48;
  ImplFn local_40;
  code *local_38;
  undefined8 local_30;
  
  QDialog::QDialog(&this->super_QDialog,parent,0x40800);
  *(undefined ***)this = &PTR_metaObject_00191a58;
  *(undefined ***)&this->field_0x10 = &PTR__MessageBox_00191c30;
  this_00 = (MessageBoxPrivate *)operator_new(0xa0);
  MessageBoxPrivate::MessageBoxPrivate(this_00,title,text,this,parent);
  (this->d).d = this_00;
  QWidget::setAttribute((WidgetAttribute)this,true);
  pMVar1 = ((this->d).d)->okButton;
  local_38 = QAbstractButton::clicked;
  local_30 = 0;
  local_48 = _q_clicked;
  local_40 = (ImplFn)0x0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::MessageBox::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar2 + 4) = _q_clicked;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)pMVar1,(QObject *)&local_38,(void **)this,
             (QSlotObjectBase *)&local_48,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  MessageBoxPrivate::adjustSize((this->d).d);
  return;
}

Assistant:

MessageBox::MessageBox( const QString & title,
	const QString & text, QWidget * parent )
	:	QDialog( parent, Qt::FramelessWindowHint | Qt::WindowStaysOnTopHint )
	,	d( new MessageBoxPrivate( title, text, this, parent ) )
{
	setAttribute( Qt::WA_MacAlwaysShowToolWindow, true );

	connect( d->okButton, &MsgBoxButton::clicked,
		this, &MessageBox::_q_clicked );

	d->adjustSize();
}